

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.hpp
# Opt level: O1

void __thiscall
boost::unordered::detail::
table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
::delete_buckets(table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
                 *this)

{
  if (this->buckets_ != (bucket_pointer)0x0) {
    if (this->size_ != 0) {
      delete_nodes(this,this->buckets_ + this->bucket_count_,(link_pointer)0x0);
    }
    operator_delete(this->buckets_,this->bucket_count_ * 8 + 8);
    this->max_load_ = 0;
    this->buckets_ = (bucket_pointer)0x0;
  }
  return;
}

Assistant:

void delete_buckets()
        {
            if(buckets_) {
                if (size_) delete_nodes(get_previous_start(), link_pointer());

                if (bucket::extra_node) {
                    node_pointer n = static_cast<node_pointer>(
                            get_bucket(bucket_count_)->next_);
                    node_allocator_traits::destroy(node_alloc(),
                            boost::addressof(*n));
                    node_allocator_traits::deallocate(node_alloc(), n, 1);
                }

                destroy_buckets();
                buckets_ = bucket_pointer();
                max_load_ = 0;
            }

            BOOST_ASSERT(!size_);
        }